

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_check_prefix(lysp_ctx *ctx,lysp_import *imports,char *module_prefix,char **value)

{
  int iVar1;
  bool bVar2;
  ly_ctx *local_50;
  ly_ctx *local_40;
  char *local_38;
  lysp_import *i;
  char **value_local;
  char *module_prefix_local;
  lysp_import *imports_local;
  lysp_ctx *ctx_local;
  
  value_local = (char **)module_prefix;
  module_prefix_local = (char *)imports;
  imports_local = (lysp_import *)ctx;
  if (((module_prefix != (char *)0x0) && (&value_local != (char ***)value)) &&
     (iVar1 = strcmp(module_prefix,*value), iVar1 == 0)) {
    if (imports_local == (lysp_import *)0x0) {
      local_40 = (ly_ctx *)0x0;
    }
    else {
      local_40 = *(ly_ctx **)
                  **(undefined8 **)
                    (*(long *)(*(long *)(imports_local->rev + 6) + 8) +
                    (ulong)(*(int *)(*(long *)(imports_local->rev + 6) + 4) - 1) * 8);
    }
    ly_vlog(local_40,(char *)0x0,LYVE_REFERENCE,"Prefix \"%s\" already used as module prefix.",
            *value);
    return LY_EEXIST;
  }
  local_38 = module_prefix_local;
  while( true ) {
    bVar2 = false;
    if (module_prefix_local != (char *)0x0) {
      bVar2 = (ulong)((long)local_38 - (long)module_prefix_local) >> 6 <
              *(ulong *)(module_prefix_local + -8);
    }
    if (!bVar2) break;
    if (((*(long *)(local_38 + 0x10) != 0) && ((char **)(local_38 + 0x10) != value)) &&
       (iVar1 = strcmp(*(char **)(local_38 + 0x10),*value), iVar1 == 0)) {
      if (imports_local == (lysp_import *)0x0) {
        local_50 = (ly_ctx *)0x0;
      }
      else {
        local_50 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(*(long *)(imports_local->rev + 6) + 8) +
                      (ulong)(*(int *)(*(long *)(imports_local->rev + 6) + 4) - 1) * 8);
      }
      ly_vlog(local_50,(char *)0x0,LYVE_REFERENCE,
              "Prefix \"%s\" already used to import \"%s\" module.",*value,
              *(undefined8 *)(local_38 + 8));
      return LY_EEXIST;
    }
    local_38 = local_38 + 0x40;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lysp_check_prefix(struct lysp_ctx *ctx, struct lysp_import *imports, const char *module_prefix, const char **value)
{
    struct lysp_import *i;

    if (module_prefix && (&module_prefix != value) && !strcmp(module_prefix, *value)) {
        LOGVAL_PARSER(ctx, LYVE_REFERENCE, "Prefix \"%s\" already used as module prefix.", *value);
        return LY_EEXIST;
    }
    LY_ARRAY_FOR(imports, struct lysp_import, i) {
        if (i->prefix && (&i->prefix != value) && !strcmp(i->prefix, *value)) {
            LOGVAL_PARSER(ctx, LYVE_REFERENCE, "Prefix \"%s\" already used to import \"%s\" module.", *value, i->name);
            return LY_EEXIST;
        }
    }
    return LY_SUCCESS;
}